

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerOperCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerOperCase *this,int measurementNdx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *op;
  pointer pAVar1;
  uint uVar2;
  pointer pAVar3;
  char *op_00;
  uint cacheAvoidanceID;
  size_type __dnew;
  string nameSpec;
  string local_a8;
  string local_88;
  pointer local_60;
  string *local_58;
  string local_50;
  
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar2 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar2 ^ uVar2 >> 0xf;
  }
  getNameSpecialization_abi_cxx11_(&local_50,(Performance *)(ulong)cacheAvoidanceID,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  op = &(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p = (pointer)op;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_isVertexCase == true) {
    binaryOpVertexTemplate_abi_cxx11_
              (&local_a8,(Performance *)(ulong)(uint)this->m_numOperations,
               (int)(this->m_oper)._M_dataplus._M_p,op->_M_local_buf);
    specializeShaderSource(&local_88,&local_a8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_60 = (pointer)0xc2;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    pAVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_60);
    pAVar1 = local_60;
    local_a8.field_2._M_allocated_capacity = (size_type)local_60;
    local_a8._M_dataplus._M_p = (pointer)pAVar3;
    memcpy(pAVar3,
           "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nin mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\to_color = v_value${NAME_SPEC} + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
           ,0xc2);
    local_a8._M_string_length = (size_type)pAVar1;
    *(undefined1 *)((long)(pAVar1->value).m_data + (long)(&pAVar3->value + -1)) = 0;
    specializeShaderSource(&local_88,&local_a8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_012f3a07;
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_60 = (pointer)0x120;
    local_58 = (string *)&__return_storage_ptr__->fragShaderSource;
    pAVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_60);
    pAVar1 = local_60;
    local_a8.field_2._M_allocated_capacity = (size_type)local_60;
    local_a8._M_dataplus._M_p = (pointer)pAVar3;
    memcpy(pAVar3,
           "#version 300 es\nin highp vec4 a_position${NAME_SPEC};\nin mediump vec4 a_value${NAME_SPEC};\nout mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tv_value${NAME_SPEC} = a_value${NAME_SPEC};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
           ,0x120);
    local_a8._M_string_length = (size_type)pAVar1;
    *(undefined1 *)((long)(pAVar1->value).m_data + (long)(&pAVar3->value + -1)) = 0;
    op_00 = (char *)0x0;
    specializeShaderSource(&local_88,&local_a8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
    binaryOpFragmentTemplate_abi_cxx11_
              (&local_a8,(Performance *)(ulong)(uint)this->m_numOperations,
               (int)(this->m_oper)._M_dataplus._M_p,op_00);
    specializeShaderSource(&local_88,&local_a8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
    std::__cxx11::string::operator=(local_58,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_012f3a07;
  }
  operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
LAB_012f3a07:
  singleValueShaderAttributes
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)&local_a8,&local_50);
  local_88.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_a8.field_2._M_allocated_capacity;
  local_88._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->vertexAttributes).
                super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_88._M_string_length =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._M_dataplus._M_p;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_a8._M_string_length;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&local_88);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&local_a8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::_M_erase_at_end(&__return_storage_ptr__->uniforms,
                    (__return_storage_ptr__->uniforms).
                    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerOperCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	if (m_isVertexCase)
	{
		result.vertShaderSource = specializeShaderSource(binaryOpVertexTemplate(m_numOperations, m_oper.c_str()), specID, SHADER_VALIDITY_VALID);
		result.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, SHADER_VALIDITY_VALID);
	}
	else
	{
		result.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, SHADER_VALIDITY_VALID);
		result.fragShaderSource = specializeShaderSource(binaryOpFragmentTemplate(m_numOperations, m_oper.c_str()), specID, SHADER_VALIDITY_VALID);
	}

	result.vertexAttributes = singleValueShaderAttributes(nameSpec);

	result.uniforms.clear(); // No uniforms used.

	return result;
}